

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdarith.c
# Opt level: O0

void jinit_arith_decoder(j_decompress_ptr cinfo)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  long in_RDI;
  int ci;
  int *coef_bit_ptr;
  int i;
  arith_entropy_ptr_conflict entropy;
  int local_24;
  undefined4 *local_20;
  int local_14;
  
  puVar1 = (undefined8 *)(*(code *)**(undefined8 **)(in_RDI + 8))(in_RDI,1,0x158);
  *(undefined8 **)(in_RDI + 0x250) = puVar1;
  *puVar1 = start_pass;
  for (local_14 = 0; local_14 < 0x10; local_14 = local_14 + 1) {
    puVar1[(long)local_14 + 10] = 0;
    puVar1[(long)local_14 + 0x1a] = 0;
  }
  *(undefined1 *)(puVar1 + 0x2a) = 0x71;
  if (*(int *)(in_RDI + 0x138) != 0) {
    uVar2 = (*(code *)**(undefined8 **)(in_RDI + 8))
                      (in_RDI,1,(long)(*(int *)(in_RDI + 0x38) << 7) << 2);
    *(undefined8 *)(in_RDI + 0xc0) = uVar2;
    local_20 = *(undefined4 **)(in_RDI + 0xc0);
    for (local_24 = 0; local_24 < *(int *)(in_RDI + 0x38); local_24 = local_24 + 1) {
      for (local_14 = 0; local_14 < 0x40; local_14 = local_14 + 1) {
        *local_20 = 0xffffffff;
        local_20 = local_20 + 1;
      }
    }
  }
  return;
}

Assistant:

GLOBAL(void)
jinit_arith_decoder(j_decompress_ptr cinfo)
{
  arith_entropy_ptr entropy;
  int i;

  entropy = (arith_entropy_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                sizeof(arith_entropy_decoder));
  cinfo->entropy = (struct jpeg_entropy_decoder *)entropy;
  entropy->pub.start_pass = start_pass;

  /* Mark tables unallocated */
  for (i = 0; i < NUM_ARITH_TBLS; i++) {
    entropy->dc_stats[i] = NULL;
    entropy->ac_stats[i] = NULL;
  }

  /* Initialize index for fixed probability estimation */
  entropy->fixed_bin[0] = 113;

  if (cinfo->progressive_mode) {
    /* Create progression status table */
    int *coef_bit_ptr, ci;
    cinfo->coef_bits = (int (*)[DCTSIZE2])
      (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                  cinfo->num_components * 2 * DCTSIZE2 *
                                  sizeof(int));
    coef_bit_ptr = &cinfo->coef_bits[0][0];
    for (ci = 0; ci < cinfo->num_components; ci++)
      for (i = 0; i < DCTSIZE2; i++)
        *coef_bit_ptr++ = -1;
  }
}